

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translation.c
# Opt level: O0

void translation_processLine
               (translation_module_t *translation_modules,FILE *out,csafestring_t *output,char *line
               )

{
  csafestring_t *in_RCX;
  translation_module_t *in_RDX;
  FILE *in_RSI;
  void *method;
  void *in_stack_ffffffffffffffd8;
  char chr;
  
  if (in_RCX == (csafestring_t *)0x0) {
    if (*in_RDX->tagOpen != '\0') {
      fprintf(in_RSI,"__internal_hfunction->safe_strcat(__internal_string, \"%s\");\n",
              in_RDX->tagOpen);
      safe_emptyBuffer((csafestring_t *)0x1044b5);
    }
  }
  else {
    while (*(char *)&in_RCX->data != '\0') {
      chr = (char)((ulong)in_stack_ffffffffffffffd8 >> 0x38);
      if ((*(char *)&in_RCX->data == '\n') && (*(char *)((long)&in_RCX->data + 1) == '\0')) {
        safe_strchrappend(in_RCX,chr);
        in_RCX = (csafestring_t *)((long)&in_RCX->data + 1);
      }
      else if (*(char *)&in_RCX->data == '\n') {
        in_RCX = (csafestring_t *)((long)&in_RCX->data + 1);
      }
      else if (((*(char *)&in_RCX->data == ' ') || (*(char *)&in_RCX->data == '\t')) &&
              ((*(char *)((long)&in_RCX->data + 1) == ' ' ||
               (*(char *)((long)&in_RCX->data + 1) == '\t')))) {
        in_RCX = (csafestring_t *)((long)&in_RCX->data + 1);
      }
      else if (*(char *)&in_RCX->data == '\t') {
        safe_strchrappend(in_RCX,chr);
        in_RCX = (csafestring_t *)((long)&in_RCX->data + 1);
      }
      else if (*(char *)&in_RCX->data == '\"') {
        safe_strcat((csafestring_t *)in_RSI,(char *)in_RDX);
        in_RCX = (csafestring_t *)((long)&in_RCX->data + 1);
      }
      else {
        in_stack_ffffffffffffffd8 = modules_matches(in_RDX,(char *)in_RCX);
        if (in_stack_ffffffffffffffd8 == (void *)0x0) {
          safe_strchrappend(in_RCX,'\0');
          in_RCX = (csafestring_t *)((long)&in_RCX->data + 1);
        }
        else {
          if (*in_RDX->tagOpen != '\0') {
            fprintf(in_RSI,"__internal_hfunction->safe_strcat(__internal_string, \"%s\");\n",
                    in_RDX->tagOpen);
            safe_emptyBuffer((csafestring_t *)0x10461f);
          }
          in_RCX = (csafestring_t *)modules_execute((FILE *)in_RSI,in_RDX,(char *)in_RCX);
        }
      }
    }
  }
  return;
}

Assistant:

static void translation_processLine(translation_module_t *translation_modules, FILE *out, csafestring_t *output, char *line) {
	void *method;

	if ( line == NULL ) {
		if ( output->data[0] != '\0' ) {
			fprintf(out, "__internal_hfunction->safe_strcat(__internal_string, \"%s\");\n", output->data);
			safe_emptyBuffer(output);
		}
		return;
	}
	
	while ( *line != '\0' ) {
		if ( *line == '\n' && *( line + 1 ) == '\0' ) {
			safe_strchrappend(output, '\0');
			line++;
		} else if ( *line == '\n' ) {
			line++;
		} else if ( ( *line == ' ' || *line == '\t' ) && ( *( line + 1 ) == ' ' || *( line + 1 ) == '\t' ) ) {
			line++;
		} else if ( *line == '\t' ) {
			safe_strchrappend(output, ' ');
			line++;
		} else if ( *line == '\"' ) {
			safe_strcat(output, "\\\"");
			line++;
		} else {
			method = modules_matches(translation_modules, line);
			if ( method != NULL ) {
				if ( output->data[0] != '\0' ) {
					fprintf(out, "__internal_hfunction->safe_strcat(__internal_string, \"%s\");\n", output->data);
					safe_emptyBuffer(output);
				}
				line = modules_execute(out, method, line);
			} else {
				safe_strchrappend(output, *line);
				line++;
			}
		}
	}
}